

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O2

void __thiscall JoystickManager::changeMasterGain(JoystickManager *this,float dDeltaPercent)

{
  float fVar1;
  float fVar2;
  
  if (-1 < (long)this->_nCurrJoyInd) {
    fVar2 = dDeltaPercent / 100.0 + this->_dMasterGain;
    this->_dMasterGain = fVar2;
    fVar1 = 1.0;
    if ((1.0 < fVar2) || (fVar1 = 0.0, fVar2 < 0.0)) {
      fVar2 = fVar1;
      this->_dMasterGain = fVar2;
    }
    (**(code **)(*(long *)(this->_vecFFDev).
                          super__Vector_base<OIS::ForceFeedback_*,_std::allocator<OIS::ForceFeedback_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[this->_nCurrJoyInd] + 0x10))
              (fVar2);
    return;
  }
  return;
}

Assistant:

void changeMasterGain(float dDeltaPercent)
	{
		if(_nCurrJoyInd >= 0)
		{
			_dMasterGain += dDeltaPercent / 100;
			if(_dMasterGain > 1.0)
				_dMasterGain = 1.0;
			else if(_dMasterGain < 0.0)
				_dMasterGain = 0.0;

			_vecFFDev[_nCurrJoyInd]->setMasterGain(_dMasterGain);
		}
	}